

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O3

void ngx_http_keepalive_handler(ngx_event_t *rev)

{
  ngx_connection_t *c;
  ngx_buf_t *pnVar1;
  ngx_log_t *log;
  uint uVar2;
  u_char *puVar3;
  int *piVar4;
  ssize_t sVar5;
  ngx_int_t nVar6;
  ngx_http_request_t *pnVar7;
  size_t size;
  
  c = (ngx_connection_t *)rev->data;
  if ((c->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,c->log,0,"http keepalive handler");
  }
  if (((rev->field_0x9 & 4) == 0) && (uVar2 = *(uint *)&c->field_0xd8, (uVar2 >> 0x10 & 1) == 0)) {
    pnVar1 = c->buffer;
    size = (long)pnVar1->end - (long)pnVar1->start;
    if (pnVar1->pos == (u_char *)0x0) {
      puVar3 = (u_char *)ngx_palloc(c->pool,size);
      pnVar1->pos = puVar3;
      if (puVar3 == (u_char *)0x0) goto LAB_00143cba;
      pnVar1->start = puVar3;
      pnVar1->last = puVar3;
      pnVar1->end = puVar3 + size;
      uVar2 = *(uint *)&c->field_0xd8;
    }
    *(uint *)&c->field_0xd8 = uVar2 & 0xfffff8ff | 0x300;
    piVar4 = __errno_location();
    *piVar4 = 0;
    sVar5 = (*c->recv)(c,pnVar1->last,size);
    *(uint *)&c->field_0xd8 = *(uint *)&c->field_0xd8 & 0xfffff8ff | 0x200;
    if (sVar5 != -1) {
      if (sVar5 == -2) {
        nVar6 = ngx_handle_read_event(rev,0);
        if (nVar6 == 0) {
          nVar6 = ngx_pfree(c->pool,pnVar1->start);
          if (nVar6 == 0) {
            pnVar1->pos = (u_char *)0x0;
          }
          return;
        }
      }
      else {
        log = c->log;
        log->handler = (ngx_log_handler_pt)0x0;
        if (sVar5 == 0) {
          if (6 < log->log_level) {
            ngx_log_error_core(7,log,*piVar4,"client %V closed keepalive connection",&c->addr_text);
          }
        }
        else {
          pnVar1->last = pnVar1->last + sVar5;
          log->handler = ngx_http_log_error;
          log->action = "reading client request line";
          c->field_0xd9 = c->field_0xd9 & 0xbf;
          ngx_reusable_connection(c,0);
          pnVar7 = ngx_http_create_request(c);
          c->data = pnVar7;
          if (pnVar7 != (ngx_http_request_t *)0x0) {
            c->sent = 0;
            c->field_0xd9 = c->field_0xd9 & 0xdf;
            if ((rev->log->log_level & 0x80) != 0) {
              ngx_log_error_core(8,rev->log,0,"event timer del: %d: %M",
                                 (ulong)*(uint *)((long)rev->data + 0x18),(rev->timer).key);
            }
            ngx_rbtree_delete(&ngx_event_timer_rbtree,&rev->timer);
            (rev->timer).left = (ngx_rbtree_node_t *)0x0;
            (rev->timer).right = (ngx_rbtree_node_t *)0x0;
            (rev->timer).parent = (ngx_rbtree_node_t *)0x0;
            rev->field_0x9 = rev->field_0x9 & 0xf7;
            rev->handler = ngx_http_process_request_line;
            ngx_http_process_request_line(rev);
            return;
          }
        }
      }
    }
  }
LAB_00143cba:
  ngx_http_close_connection(c);
  return;
}

Assistant:

static void
ngx_http_keepalive_handler(ngx_event_t *rev)
{
    size_t             size;
    ssize_t            n;
    ngx_buf_t         *b;
    ngx_connection_t  *c;

    c = rev->data;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0, "http keepalive handler");

    if (rev->timedout || c->close) {
        ngx_http_close_connection(c);
        return;
    }

#if (NGX_HAVE_KQUEUE)

    if (ngx_event_flags & NGX_USE_KQUEUE_EVENT) {
        if (rev->pending_eof) {
            c->log->handler = NULL;
            ngx_log_error(NGX_LOG_INFO, c->log, rev->kq_errno,
                          "kevent() reported that client %V closed "
                          "keepalive connection", &c->addr_text);
#if (NGX_HTTP_SSL)
            if (c->ssl) {
                c->ssl->no_send_shutdown = 1;
            }
#endif
            ngx_http_close_connection(c);
            return;
        }
    }

#endif

    b = c->buffer;
    size = b->end - b->start;

    if (b->pos == NULL) {

        /*
         * The c->buffer's memory was freed by ngx_http_set_keepalive().
         * However, the c->buffer->start and c->buffer->end were not changed
         * to keep the buffer size.
         */

        b->pos = ngx_palloc(c->pool, size);
        if (b->pos == NULL) {
            ngx_http_close_connection(c);
            return;
        }

        b->start = b->pos;
        b->last = b->pos;
        b->end = b->pos + size;
    }

    /*
     * MSIE closes a keepalive connection with RST flag
     * so we ignore ECONNRESET here.
     */

    c->log_error = NGX_ERROR_IGNORE_ECONNRESET;
    ngx_set_socket_errno(0);

    n = c->recv(c, b->last, size);
    c->log_error = NGX_ERROR_INFO;

    if (n == NGX_AGAIN) {
        if (ngx_handle_read_event(rev, 0) != NGX_OK) {
            ngx_http_close_connection(c);
            return;
        }

        /*
         * Like ngx_http_set_keepalive() we are trying to not hold
         * c->buffer's memory for a keepalive connection.
         */

        if (ngx_pfree(c->pool, b->start) == NGX_OK) {

            /*
             * the special note that c->buffer's memory was freed
             */

            b->pos = NULL;
        }

        return;
    }

    if (n == NGX_ERROR) {
        ngx_http_close_connection(c);
        return;
    }

    c->log->handler = NULL;

    if (n == 0) {
        ngx_log_error(NGX_LOG_INFO, c->log, ngx_socket_errno,
                      "client %V closed keepalive connection", &c->addr_text);
        ngx_http_close_connection(c);
        return;
    }

    b->last += n;

    c->log->handler = ngx_http_log_error;
    c->log->action = "reading client request line";

    c->idle = 0;
    ngx_reusable_connection(c, 0);

    c->data = ngx_http_create_request(c);
    if (c->data == NULL) {
        ngx_http_close_connection(c);
        return;
    }

    c->sent = 0;
    c->destroyed = 0;

    ngx_del_timer(rev);

    rev->handler = ngx_http_process_request_line;
    ngx_http_process_request_line(rev);
}